

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.cc
# Opt level: O1

Flags * __thiscall pstack::Flags::parse(Flags *this,int argc,char **argv)

{
  mapped_type *pmVar1;
  runtime_error *this_00;
  undefined8 uVar2;
  map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
  *local_58 [2];
  long local_48 [2];
  undefined4 local_38;
  int local_34;
  int optidx;
  int c;
  
  while( true ) {
    local_38 = 0;
    local_34 = getopt_long(argc,argv,*(undefined8 *)(this + 0x48),*(undefined8 *)this,&local_38);
    if (local_34 == -1) {
      return this;
    }
    if (local_34 == 0x3f) break;
    pmVar1 = std::
             map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
             ::at((map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
                   *)(this + 0x18),&local_34);
    local_58[0] = _optarg;
    if ((pmVar1->callback).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar2 = std::__throw_bad_function_call();
      if (local_58[0] !=
          (map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
           *)(this + 0x18)) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      if ((char)argc != '\0') {
        __cxa_free_exception(this);
      }
      _Unwind_Resume(uVar2);
    }
    (*(pmVar1->callback)._M_invoker)((_Any_data *)&pmVar1->callback,(char **)local_58);
  }
  dump(this,(ostream *)&std::clog);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_58[0] = (map<int,_pstack::Flags::Data,_std::less<int>,_std::allocator<std::pair<const_int,_pstack::Flags::Data>_>_>
                 *)local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"unknown command line option ","");
  std::runtime_error::runtime_error(this_00,(string *)local_58);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Flags &
Flags::parse(int argc, char **argv) const
{
    for (;;) {
       int optidx = 0;
       int c = getopt_long(argc, argv, shortOptions.c_str(), longOptions.data(), &optidx);
       if (c == -1)
          break;

        if (c == '?') {
           dump(std::clog);
           throw std::runtime_error(std::string("unknown command line option "));
        }
        data.at(c).callback(optarg);
    }
    return *this;
}